

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instances.cc
# Opt level: O3

int __thiscall
aliyun::Drds::DescribeDrdsInstances
          (Drds *this,DrdsDescribeDrdsInstancesRequestType *req,
          DrdsDescribeDrdsInstancesResponseType *response,DrdsErrorInfo *error_info)

{
  iterator *piVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ArrayIndex AVar5;
  Int IVar6;
  char *pcVar7;
  AliRpcRequest *this_00;
  long *plVar8;
  size_t sVar9;
  Value *pVVar10;
  Value *pVVar11;
  Value *pVVar12;
  size_type *psVar13;
  uint uVar14;
  Value val;
  string secheme;
  string str_response;
  Reader reader;
  Value VStack_498;
  undefined1 local_480 [32];
  _Alloc_hider local_460;
  size_type local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Alloc_hider local_440;
  size_type local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430;
  DrdsDescribeDrdsInstancesResponseType *local_420;
  string local_418;
  uint local_3f4;
  long *local_3f0;
  long local_3e8;
  long local_3e0 [2];
  string local_3d0;
  Value *local_3b0;
  string local_3a8;
  undefined1 local_388 [24];
  string local_370 [8];
  size_type local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  _Alloc_hider local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  long local_290;
  long local_288;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  pcVar7 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar7 = "https";
  }
  local_3f0 = local_3e0;
  local_420 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,pcVar7,pcVar7 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)local_388);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)local_480);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_418);
  piVar1 = &local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_start;
  local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
  super__Deque_impl_data._M_map = &piVar1->_M_cur;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_140,local_3f0,local_3e8 + (long)local_3f0);
  std::__cxx11::string::append((char *)&local_140);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_140);
  psVar13 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_3a8.field_2._M_allocated_capacity = *psVar13;
    local_3a8.field_2._8_8_ = plVar8[3];
    local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  }
  else {
    local_3a8.field_2._M_allocated_capacity = *psVar13;
    local_3a8._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_3a8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_3a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
  }
  if ((iterator *)
      local_140.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_map != piVar1) {
    operator_delete(local_140.nodes_.c.
                    super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                    super__Deque_impl_data._M_map,
                    (long)local_140.nodes_.c.
                          super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar7 = this->proxy_host_, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar9 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar7,pcVar7 + sVar9);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&VStack_498,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"DescribeDrdsInstances","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->type)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Type","");
    pcVar2 = (req->type)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar2,pcVar2 + (req->type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_388);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  iVar4 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar4 == 0) {
    iVar4 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_3d0);
    if (((0 < iVar4) && (local_3d0._M_string_length != 0)) &&
       (bVar3 = Json::Reader::parse(&local_140,&local_3d0,&VStack_498,true), bVar3)) {
      if (error_info != (DrdsErrorInfo *)0x0 && iVar4 != 200) {
        bVar3 = Json::Value::isMember(&VStack_498,"RequestId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_498,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_388,pVVar10);
        }
        else {
          local_388._0_8_ = local_388 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_388,anon_var_dwarf_178d17 + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_388);
        pcVar2 = local_388 + 0x10;
        if ((pointer)local_388._0_8_ != pcVar2) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_498,"Code");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_498,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_388,pVVar10);
        }
        else {
          local_388._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_388,anon_var_dwarf_178d17 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_388);
        if ((pointer)local_388._0_8_ != pcVar2) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_498,"HostId");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_498,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_388,pVVar10);
        }
        else {
          local_388._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_388,anon_var_dwarf_178d17 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_388);
        if ((pointer)local_388._0_8_ != pcVar2) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
        }
        bVar3 = Json::Value::isMember(&VStack_498,"Message");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_498,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_388,pVVar10);
        }
        else {
          local_388._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_388,anon_var_dwarf_178d17 + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_388);
        if ((pointer)local_388._0_8_ != pcVar2) {
          operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
        }
      }
      if (local_420 != (DrdsDescribeDrdsInstancesResponseType *)0x0 && iVar4 == 200) {
        bVar3 = Json::Value::isMember(&VStack_498,"Success");
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_498,"Success");
          bVar3 = Json::Value::asBool(pVVar10);
          local_420->success = bVar3;
        }
        bVar3 = Json::Value::isMember(&VStack_498,"Data");
        iVar4 = 200;
        if (bVar3) {
          pVVar10 = Json::Value::operator[](&VStack_498,"Data");
          bVar3 = Json::Value::isMember(pVVar10,"Instance");
          if (bVar3) {
            pVVar10 = Json::Value::operator[](&VStack_498,"Data");
            pVVar10 = Json::Value::operator[](pVVar10,"Instance");
            bVar3 = Json::Value::isArray(pVVar10);
            if ((bVar3) && (AVar5 = Json::Value::size(pVVar10), AVar5 != 0)) {
              pcVar2 = local_480 + 0x10;
              uVar14 = 0;
              local_3b0 = pVVar10;
              do {
                local_388._0_8_ = (pointer)0x0;
                local_388._8_8_ = (pointer)0x0;
                local_388._16_8_ = 0;
                local_370 = (string  [8])&local_360;
                local_368 = 0;
                local_360._M_local_buf[0] = '\0';
                local_350._M_p = (pointer)&local_340;
                local_348 = 0;
                local_340._M_local_buf[0] = '\0';
                local_330._M_p = (pointer)&local_320;
                local_328 = 0;
                local_320._M_local_buf[0] = '\0';
                local_310._M_p = (pointer)&local_300;
                local_308 = 0;
                local_300._M_local_buf[0] = '\0';
                local_2f0._M_p = (pointer)&local_2e0;
                local_2e8 = 0;
                local_2e0._M_local_buf[0] = '\0';
                local_2d0._M_p = (pointer)&local_2c0;
                local_2c8 = 0;
                local_2c0._M_local_buf[0] = '\0';
                local_2b0._M_p = (pointer)&local_2a0;
                local_2a8 = 0;
                local_2a0._M_local_buf[0] = '\0';
                local_3f4 = uVar14;
                pVVar10 = Json::Value::operator[](pVVar10,uVar14);
                bVar3 = Json::Value::isMember(pVVar10,"DrdsInstanceId");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"DrdsInstanceId");
                  Json::Value::asString_abi_cxx11_((string *)local_480,pVVar11);
                  std::__cxx11::string::operator=(local_370,(string *)local_480);
                  if ((pointer)local_480._0_8_ != pcVar2) {
                    operator_delete((void *)local_480._0_8_,
                                    CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"Type");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Type");
                  Json::Value::asString_abi_cxx11_((string *)local_480,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_350,(string *)local_480);
                  if ((pointer)local_480._0_8_ != pcVar2) {
                    operator_delete((void *)local_480._0_8_,
                                    CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"RegionId");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"RegionId");
                  Json::Value::asString_abi_cxx11_((string *)local_480,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_330,(string *)local_480);
                  if ((pointer)local_480._0_8_ != pcVar2) {
                    operator_delete((void *)local_480._0_8_,
                                    CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"ZoneId");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"ZoneId");
                  Json::Value::asString_abi_cxx11_((string *)local_480,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_310,(string *)local_480);
                  if ((pointer)local_480._0_8_ != pcVar2) {
                    operator_delete((void *)local_480._0_8_,
                                    CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"Description");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Description");
                  Json::Value::asString_abi_cxx11_((string *)local_480,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_2f0,(string *)local_480);
                  if ((pointer)local_480._0_8_ != pcVar2) {
                    operator_delete((void *)local_480._0_8_,
                                    CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"NetworkType");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"NetworkType");
                  Json::Value::asString_abi_cxx11_((string *)local_480,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_2d0,(string *)local_480);
                  if ((pointer)local_480._0_8_ != pcVar2) {
                    operator_delete((void *)local_480._0_8_,
                                    CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"Status");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Status");
                  Json::Value::asString_abi_cxx11_((string *)local_480,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_2b0,(string *)local_480);
                  if ((pointer)local_480._0_8_ != pcVar2) {
                    operator_delete((void *)local_480._0_8_,
                                    CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
                  }
                }
                bVar3 = Json::Value::isMember(pVVar10,"CreateTime");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"CreateTime");
                  IVar6 = Json::Value::asInt(pVVar11);
                  local_290 = (long)IVar6;
                }
                bVar3 = Json::Value::isMember(pVVar10,"Version");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Version");
                  IVar6 = Json::Value::asInt(pVVar11);
                  local_288 = (long)IVar6;
                }
                bVar3 = Json::Value::isMember(pVVar10,"Vips");
                if (bVar3) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Vips");
                  bVar3 = Json::Value::isMember(pVVar11,"Vip");
                  if (bVar3) {
                    pVVar10 = Json::Value::operator[](pVVar10,"Vips");
                    pVVar10 = Json::Value::operator[](pVVar10,"Vip");
                    bVar3 = Json::Value::isArray(pVVar10);
                    if ((bVar3) && (AVar5 = Json::Value::size(pVVar10), AVar5 != 0)) {
                      uVar14 = 0;
                      do {
                        local_480._8_8_ = 0;
                        local_480[0x10] = '\0';
                        local_460._M_p = (pointer)&local_450;
                        local_458 = 0;
                        local_450._M_local_buf[0] = '\0';
                        local_440._M_p = (pointer)&local_430;
                        local_438 = 0;
                        local_430._M_local_buf[0] = '\0';
                        local_480._0_8_ = pcVar2;
                        pVVar11 = Json::Value::operator[](pVVar10,uVar14);
                        bVar3 = Json::Value::isMember(pVVar11,"IP");
                        if (bVar3) {
                          pVVar12 = Json::Value::operator[](pVVar11,"IP");
                          Json::Value::asString_abi_cxx11_(&local_418,pVVar12);
                          std::__cxx11::string::operator=((string *)local_480,(string *)&local_418);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_418._M_dataplus._M_p != &local_418.field_2) {
                            operator_delete(local_418._M_dataplus._M_p,
                                            local_418.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar11,"Port");
                        if (bVar3) {
                          pVVar12 = Json::Value::operator[](pVVar11,"Port");
                          Json::Value::asString_abi_cxx11_(&local_418,pVVar12);
                          std::__cxx11::string::operator=((string *)&local_460,(string *)&local_418)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_418._M_dataplus._M_p != &local_418.field_2) {
                            operator_delete(local_418._M_dataplus._M_p,
                                            local_418.field_2._M_allocated_capacity + 1);
                          }
                        }
                        bVar3 = Json::Value::isMember(pVVar11,"Type");
                        if (bVar3) {
                          pVVar11 = Json::Value::operator[](pVVar11,"Type");
                          Json::Value::asString_abi_cxx11_(&local_418,pVVar11);
                          std::__cxx11::string::operator=((string *)&local_440,(string *)&local_418)
                          ;
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_418._M_dataplus._M_p != &local_418.field_2) {
                            operator_delete(local_418._M_dataplus._M_p,
                                            local_418.field_2._M_allocated_capacity + 1);
                          }
                        }
                        std::
                        vector<aliyun::DrdsDescribeDrdsInstancesVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesVipType>_>
                        ::push_back((vector<aliyun::DrdsDescribeDrdsInstancesVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesVipType>_>
                                     *)local_388,(value_type *)local_480);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_440._M_p != &local_430) {
                          operator_delete(local_440._M_p,
                                          CONCAT71(local_430._M_allocated_capacity._1_7_,
                                                   local_430._M_local_buf[0]) + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_460._M_p != &local_450) {
                          operator_delete(local_460._M_p,
                                          CONCAT71(local_450._M_allocated_capacity._1_7_,
                                                   local_450._M_local_buf[0]) + 1);
                        }
                        if ((pointer)local_480._0_8_ != pcVar2) {
                          operator_delete((void *)local_480._0_8_,
                                          CONCAT71(local_480._17_7_,local_480[0x10]) + 1);
                        }
                        AVar5 = Json::Value::size(pVVar10);
                        uVar14 = uVar14 + 1;
                      } while (uVar14 < AVar5);
                    }
                  }
                }
                std::
                vector<aliyun::DrdsDescribeDrdsInstancesInstanceType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesInstanceType>_>
                ::push_back(&local_420->data,(value_type *)local_388);
                DrdsDescribeDrdsInstancesInstanceType::~DrdsDescribeDrdsInstancesInstanceType
                          ((DrdsDescribeDrdsInstancesInstanceType *)local_388);
                pVVar10 = local_3b0;
                AVar5 = Json::Value::size(local_3b0);
                uVar14 = local_3f4 + 1;
              } while (uVar14 < AVar5);
            }
          }
        }
      }
      goto LAB_001335c5;
    }
    if (error_info == (DrdsErrorInfo *)0x0) goto LAB_001335c0;
    pcVar7 = "parse response failed";
  }
  else {
    if (error_info == (DrdsErrorInfo *)0x0) {
LAB_001335c0:
      iVar4 = -1;
      goto LAB_001335c5;
    }
    pcVar7 = "connect to host failed";
  }
  iVar4 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar7);
LAB_001335c5:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&VStack_498);
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0,local_3e0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT71(local_3d0.field_2._M_allocated_capacity._1_7_,
                             local_3d0.field_2._M_local_buf[0]) + 1);
  }
  return iVar4;
}

Assistant:

int Drds::DescribeDrdsInstances(const DrdsDescribeDrdsInstancesRequestType& req,
                      DrdsDescribeDrdsInstancesResponseType* response,
                       DrdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDrdsInstances");
  if(!req.type.empty()) {
    req_rpc->AddRequestQuery("Type", req.type);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}